

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O1

void __thiscall Centaurus::BaseRunner::release_memory(BaseRunner *this,bool is_finalizing)

{
  if (this->m_main_window != (void *)0xffffffffffffffff) {
    munmap(this->m_main_window,
           (long)this->m_bank_num * (this->m_bank_size + 0x7fffff & 0xffffffffff800000));
  }
  if (this->m_sub_window != (void *)0xffffffffffffffff) {
    munmap(this->m_sub_window,(long)this->m_bank_num * 8 + 0x7fffffU & 0xffffffffff800000);
  }
  if (is_finalizing) {
    shm_unlink(this->m_memory_name);
    return;
  }
  return;
}

Assistant:

void release_memory(bool is_finalizing)
  {
#if defined(CENTAURUS_BUILD_WINDOWS)
    if (m_main_window != NULL) UnmapViewOfFile(m_main_window);
    if (m_sub_window != NULL)  UnmapViewOfFile(m_sub_window);
    if (m_mem_handle != NULL)  CloseHandle(m_mem_handle);
#elif defined(CENTAURUS_BUILD_LINUX)
    if (m_main_window != MAP_FAILED) munmap(m_main_window, get_main_window_size());
    if (m_sub_window != MAP_FAILED)  munmap(m_sub_window, get_sub_window_size());
    if (is_finalizing) {
      shm_unlink(m_memory_name);
    }
#endif
  }